

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O0

int __thiscall pstore::file::unlink(file *this,char *__name)

{
  int iVar1;
  char *__name_00;
  int *piVar2;
  string local_38 [32];
  int local_18;
  byte local_11;
  int err;
  bool allow_noent_local;
  string *path_local;
  
  local_11 = (byte)__name & 1;
  _err = this;
  __name_00 = (char *)std::__cxx11::string::c_str();
  iVar1 = ::unlink(__name_00);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    if (((local_11 & 1) == 0) || (iVar1 != 2)) {
      local_18 = iVar1;
      std::__cxx11::string::string(local_38,(string *)_err);
      (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
                (iVar1,"unlink failed",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    }
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

void unlink (std::string const & path, bool const allow_noent) {
            if (::unlink (path.c_str ()) == -1) {
                int const err = errno;
                if (!allow_noent || err != ENOENT) {
                    raise_file_error (err, "unlink failed", path);
                }
            }
        }